

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall
Variable_removeVariableMethods_Test::TestBody(Variable_removeVariableMethods_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  undefined1 uVar3;
  char cVar4;
  AssertHelper AVar5;
  char *pcVar6;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  string a;
  ComponentPtr c;
  PrinterPtr printer;
  VariablePtr v3;
  ModelPtr m;
  VariablePtr v2;
  VariablePtr v1;
  VariablePtr v4;
  string in;
  VariablePtr v5;
  string e1;
  string e2;
  long *local_170;
  long *local_168;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  AssertHelper local_158 [8];
  AssertionResult local_150;
  long local_140 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  long *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  string *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  string local_e0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  string *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  string *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  string *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  long *local_a0 [2];
  long local_90 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"valid_name","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"valid_name\">\n    <variable name=\"variable2\"/>\n  </component>\n</model>\n"
             ,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"valid_name\"/>\n</model>\n"
             ,"");
  paVar1 = &local_130.field_2;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  pcVar6 = "";
  local_150._0_8_ = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"","");
  createModelWithComponent(local_e0,(string *)&local_130);
  if ((long *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_,local_140[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  libcellml::ComponentEntity::component((ulong)&local_110);
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::NamedEntity::setName(local_110);
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"variable1","");
  libcellml::NamedEntity::setName(local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"variable2","");
  libcellml::NamedEntity::setName(local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"variable3","");
  libcellml::NamedEntity::setName(local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"variable4","");
  libcellml::NamedEntity::setName(local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  libcellml::Component::addVariable((shared_ptr *)local_110);
  libcellml::Component::addVariable((shared_ptr *)local_110);
  libcellml::Component::addVariable((shared_ptr *)local_110);
  psVar2 = local_110;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"variable1","");
  uVar3 = libcellml::Component::removeVariable(psVar2);
  local_150.success_ = (bool)uVar3;
  local_150.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((string)local_150.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_130,&local_150.success_,"c->removeVariable(\"variable1\")",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2ce,local_130._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100 != (long *)0x0)) {
        (**(code **)(*local_100 + 8))();
      }
      local_100 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cVar4 = libcellml::Component::removeVariable((shared_ptr *)local_110);
  local_150.success_ = (bool)cVar4;
  local_150.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (cVar4 == '\0') {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_130,&local_150.success_,"c->removeVariable(v3)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2cf,local_130._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100 != (long *)0x0)) {
        (**(code **)(*local_100 + 8))();
      }
      local_100 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_130,SUB81(local_100,0));
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_150,"e1","a",&local_70,&local_130);
  if ((string)local_150.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (local_150.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = ((local_150.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2d2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if (local_168 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_168 != (long *)0x0)) {
        (**(code **)(*local_168 + 8))();
      }
      local_168 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  psVar2 = local_110;
  local_150._0_8_ = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"BAD_NAME","");
  uVar3 = libcellml::Component::removeVariable(psVar2);
  local_168 = (long *)(CONCAT71(local_168._1_7_,uVar3) ^ 1);
  local_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_,local_140[0] + 1);
  }
  if (local_168._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(char *)&local_168,"c->removeVariable(\"BAD_NAME\")","true");
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2d3,(char *)local_150._0_8_);
    testing::internal::AssertHelper::operator=(local_158,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    if ((long *)local_150._0_8_ != local_140) {
      operator_delete((void *)local_150._0_8_,local_140[0] + 1);
    }
    if (local_170 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_170 != (long *)0x0)) {
        (**(code **)(*local_170 + 8))();
      }
      local_170 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Component::addVariable((shared_ptr *)local_110);
  libcellml::Component::removeAllVariables();
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_150,SUB81(local_100,0));
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
  if ((long *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_,local_140[0] + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_150,"e2","a",&local_50,&local_130);
  if ((string)local_150.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (local_150.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_150.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2d8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if (local_168 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_168 != (long *)0x0)) {
        (**(code **)(*local_168 + 8))();
      }
      local_168 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cVar4 = libcellml::Component::removeVariable((shared_ptr *)local_110);
  local_168 = (long *)(CONCAT71(local_168._1_7_,cVar4) ^ 1);
  local_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(char *)&local_168,"c->removeVariable(v5)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2d9,(char *)local_150._0_8_);
    testing::internal::AssertHelper::operator=(local_158,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    if ((long *)local_150._0_8_ != local_140) {
      operator_delete((void *)local_150._0_8_,local_140[0] + 1);
    }
    if (local_170 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_170 != (long *)0x0)) {
        (**(code **)(*local_170 + 8))();
      }
      local_170 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Component::addVariable((shared_ptr *)local_110);
  libcellml::Component::addVariable((shared_ptr *)local_110);
  libcellml::Component::addVariable((shared_ptr *)local_110);
  AVar5 = (AssertHelper)libcellml::Component::removeVariable((ulong)local_110);
  local_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_168._0_1_ = AVar5;
  if (AVar5 == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(char *)&local_168,"c->removeVariable(0)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2df,(char *)local_150._0_8_);
    testing::internal::AssertHelper::operator=(local_158,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    if ((long *)local_150._0_8_ != local_140) {
      operator_delete((void *)local_150._0_8_,local_140[0] + 1);
    }
    if (local_170 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_170 != (long *)0x0)) {
        (**(code **)(*local_170 + 8))();
      }
      local_170 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = libcellml::Component::removeVariable((ulong)local_110);
  local_168 = (long *)CONCAT71(local_168._1_7_,cVar4);
  local_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 == '\0') {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(char *)&local_168,"c->removeVariable(1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2e0,(char *)local_150._0_8_);
    testing::internal::AssertHelper::operator=(local_158,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    if ((long *)local_150._0_8_ != local_140) {
      operator_delete((void *)local_150._0_8_,local_140[0] + 1);
    }
    if (local_170 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_170 != (long *)0x0)) {
        (**(code **)(*local_170 + 8))();
      }
      local_170 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_150,SUB81(local_100,0));
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
  if ((long *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_,local_140[0] + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_150,"e1","a",&local_70,&local_130);
  if ((string)local_150.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (local_150.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_150.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2e2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if (local_168 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_168 != (long *)0x0)) {
        (**(code **)(*local_168 + 8))();
      }
      local_168 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cVar4 = libcellml::Component::removeVariable((ulong)local_110);
  local_168 = (long *)(CONCAT71(local_168._1_7_,cVar4) ^ 1);
  local_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(char *)&local_168,"c->removeVariable(1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2e3,(char *)local_150._0_8_);
    testing::internal::AssertHelper::operator=(local_158,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    if ((long *)local_150._0_8_ != local_140) {
      operator_delete((void *)local_150._0_8_,local_140[0] + 1);
    }
    if (local_170 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_170 != (long *)0x0)) {
        (**(code **)(*local_170 + 8))();
      }
      local_170 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_160,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  return;
}

Assistant:

TEST(Variable, setInitialValueByDouble)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <variable initial_value=\"0\"/>\n"
        "  </component>\n"
        "</model>\n";
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v = libcellml::Variable::create();
    double value = 0.0;
    v->setInitialValue(value);
    c->addVariable(v);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}